

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_receiver.c
# Opt level: O2

apx_error_t
apx_fileManagerReceiver_write
          (apx_fileManagerReceiver_t *self,apx_fileManagerReceptionResult_t *result,uint32_t address
          ,uint8_t *data,apx_size_t size,_Bool more_bit)

{
  uint uVar1;
  
  if (0x7ffffffe < address) {
    return 1;
  }
  if (self == (apx_fileManagerReceiver_t *)0x0) {
    return 1;
  }
  if (result == (apx_fileManagerReceptionResult_t *)0x0) {
    return 1;
  }
  if (data == (uint8_t *)0x0) {
    return 1;
  }
  if (0x1000000 < size) {
    return 0x20;
  }
  result->is_complete = false;
  result->address = 0x7fffffff;
  result->data = (uint8_t *)0x0;
  result->size = 0;
  if (self->start_address == 0x7fffffff) {
    if (self->buf_size == 0) {
      return 0x19;
    }
    if (self->buf_data == (uint8_t *)0x0) {
      return 0x19;
    }
    if (self->buf_size < size) {
      return 0x26;
    }
    if (size != 0) {
      memcpy(self->buf_data,data,(ulong)size);
      self->buf_pos = size;
    }
    self->start_address = address;
  }
  else {
    uVar1 = self->buf_pos;
    if (self->start_address + uVar1 != address) {
      return 0x38;
    }
    if (self->buf_size == 0) {
      return 0x19;
    }
    if (self->buf_data == (uint8_t *)0x0) {
      return 0x19;
    }
    if (self->buf_size < uVar1 + size) {
      return 0x26;
    }
    if (size != 0) {
      memcpy(self->buf_data + uVar1,data,(ulong)size);
      self->buf_pos = self->buf_pos + size;
    }
  }
  process_more_bit(self,result,more_bit);
  return 0;
}

Assistant:

apx_error_t apx_fileManagerReceiver_write(apx_fileManagerReceiver_t* self, apx_fileManagerReceptionResult_t* result, uint32_t address, uint8_t const* data, apx_size_t size, bool more_bit)
{
   if ( (self != NULL) && (result != NULL) && (data != NULL) && (address < RMF_INVALID_ADDRESS) )
   {
      apx_error_t retval = APX_NO_ERROR;
      if (size > APX_MAX_FILE_SIZE)
      {
         retval = APX_FILE_TOO_LARGE_ERROR;
      }
      else
      {
         result->is_complete = false;
         result->address = RMF_INVALID_ADDRESS;
         result->data = NULL;
         result->size = 0u;

         if (self->start_address == RMF_INVALID_ADDRESS)
         {
            retval = start_new_reception(self, result, address, data, size, more_bit);
         }
         else
         {
            retval = continue_reception(self, result, address, data, size, more_bit);
         }
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}